

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<cbtDbvt::sStkNN>::copy
          (cbtAlignedObjectArray<cbtDbvt::sStkNN> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  long in_RCX;
  int i;
  long lVar4;
  
  lVar3 = (long)(int)dst;
  lVar4 = lVar3 << 4;
  for (; lVar3 < (int)src; lVar3 = lVar3 + 1) {
    puVar1 = (undefined8 *)((long)&this->m_data->a + lVar4);
    uVar2 = puVar1[1];
    *(undefined8 *)(in_RCX + lVar4) = *puVar1;
    ((undefined8 *)(in_RCX + lVar4))[1] = uVar2;
    lVar4 = lVar4 + 0x10;
  }
  return (int)lVar3;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}